

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage4.cpp
# Opt level: O3

void test(bool verbose)

{
  int iVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  Framer framer;
  pstring astring;
  test_resource tpmr;
  char local_159;
  long *local_158;
  long local_150;
  long local_148 [2];
  Framer local_138;
  test_resource *local_130;
  undefined8 local_128;
  undefined8 *local_120;
  test_resource local_118;
  
  Framer::Framer(&local_138,"Stage4",verbose);
  std::pmr::test_resource::test_resource(&local_118,"stage4",verbose);
  local_118.m_no_abort_flag_.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
  local_128 = 7;
  local_130 = &local_118;
  puVar2 = (undefined8 *)(**(code **)(local_118._0_8_ + 0x10))(&local_118,8,1);
  *puVar2 = 0x6c6f6f66726162;
  local_158 = local_148;
  local_120 = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,puVar2,(long)puVar2 + 7);
  iVar1 = std::__cxx11::string::compare((char *)&local_158);
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"astring.str()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"barfool\"",9);
    local_158 = (long *)CONCAT71(local_158._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_158,1);
    local_158 = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,puVar2,(long)puVar2 + 7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_158,local_150);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"barfool",7);
    local_159 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_159,1);
    if (local_158 != local_148) {
      operator_delete(local_158,local_148[0] + 1);
    }
  }
  (**(code **)(local_118._0_8_ + 0x18))(&local_118,puVar2,8,1);
  std::pmr::test_resource::~test_resource(&local_118);
  Framer::~Framer(&local_138);
  return;
}

Assistant:

void test(bool verbose)
{
    Framer framer{ "Stage4", verbose };

    std::pmr::test_resource tpmr{ "stage4", verbose };
    tpmr.set_no_abort(true);

    pstring astring{ "barfool", &tpmr };

    ASSERT_EQ(astring.str(), "barfool");
}